

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FFontChar2::~FFontChar2(FFontChar2 *this)

{
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar2_00703180;
  if (this->Pixels != (BYTE *)0x0) {
    operator_delete__(this->Pixels);
    this->Pixels = (BYTE *)0x0;
  }
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FFontChar2::~FFontChar2 ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}